

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O2

void __thiscall
boost::runtime::arguments_store::set<bool>
          (arguments_store *this,cstring *parameter_name,bool *value)

{
  typed_argument<bool> *p;
  mapped_type *this_00;
  shared_ptr<boost::runtime::argument> sStack_28;
  
  p = (typed_argument<bool> *)operator_new(0x18);
  (p->super_argument).p_value_type = (id_t)&rtti::rtti_detail::rttid_holder<bool>::inst()::s_inst;
  (p->super_argument)._vptr_argument = (_func_int **)&PTR__argument_001e0eb8;
  (p->p_value).super_class_property<bool>.value = *value;
  shared_ptr<boost::runtime::argument>::shared_ptr<boost::runtime::typed_argument<bool>>
            (&sStack_28,p);
  this_00 = std::
            map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
            ::operator[](&this->m_arguments,parameter_name);
  shared_ptr<boost::runtime::argument>::operator=(this_00,&sStack_28);
  detail::shared_count::~shared_count(&sStack_28.pn);
  return;
}

Assistant:

void        set( cstring parameter_name, T const& value )
    {
        m_arguments[parameter_name] = argument_ptr( new typed_argument<T>( value ) );
    }